

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executionengine.cpp
# Opt level: O2

void __thiscall ExecutionEngine::i_putstatic(ExecutionEngine *this)

{
  char cVar1;
  u2 index;
  cp_info *pcVar2;
  bool bVar3;
  Frame *pFVar4;
  cp_info **ppcVar5;
  u1 *puVar6;
  char *pcVar7;
  MethodArea *this_00;
  ClassRuntime *pCVar8;
  ClassFile *pCVar9;
  ostream *poVar10;
  ulong uVar11;
  ulong uVar12;
  ClassRuntime *this_01;
  Value VVar13;
  allocator local_101;
  Frame *local_100;
  VMStack *local_f8;
  string fieldName;
  string fieldDescriptor;
  string local_b0;
  string className;
  string superClassName;
  string local_50;
  
  local_f8 = VMStack::getInstance();
  pFVar4 = VMStack::getTopFrame(local_f8);
  ppcVar5 = Frame::getConstantPool(pFVar4);
  pcVar2 = *ppcVar5;
  local_100 = pFVar4;
  puVar6 = Frame::getCode(pFVar4,pFVar4->pc);
  uVar12 = (ulong)(ushort)(*(ushort *)(puVar6 + 1) << 8 | *(ushort *)(puVar6 + 1) >> 8);
  if (pcVar2[uVar12 - 1].tag != '\t') {
    __assert_fail("fieldCP.tag == CONSTANT_Fieldref",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                  ,0xe25,"void ExecutionEngine::i_putstatic()");
  }
  uVar11 = (ulong)pcVar2[uVar12 - 1].info.fieldref_info.name_and_type_index;
  pcVar7 = getFormattedConstant(pcVar2,pcVar2[uVar12 - 1].info.fieldref_info.class_index);
  std::__cxx11::string::string((string *)&className,pcVar7,(allocator *)&fieldName);
  if (pcVar2[uVar11 - 1].tag == '\f') {
    index = pcVar2[uVar11 - 1].info.fieldref_info.name_and_type_index;
    pcVar7 = getFormattedConstant(pcVar2,pcVar2[uVar11 - 1].info.fieldref_info.class_index);
    std::__cxx11::string::string((string *)&fieldName,pcVar7,(allocator *)&fieldDescriptor);
    pcVar7 = getFormattedConstant(pcVar2,index);
    std::__cxx11::string::string((string *)&fieldDescriptor,pcVar7,(allocator *)&superClassName);
    this_00 = MethodArea::getInstance();
    pCVar8 = MethodArea::loadClassNamed(this_00,&className);
    while( true ) {
      this_01 = pCVar8;
      if (this_01 == (ClassRuntime *)0x0) {
        poVar10 = std::operator<<((ostream *)&std::cerr,"NoSuchFieldError");
        std::endl<char,std::char_traits<char>>(poVar10);
        exit(1);
      }
      std::__cxx11::string::string((string *)&local_50,(string *)&fieldName);
      bVar3 = ClassRuntime::fieldExists(this_01,&local_50);
      std::__cxx11::string::~string((string *)&local_50);
      if (bVar3) break;
      pCVar9 = ClassRuntime::getClassFile(this_01);
      pCVar8 = (ClassRuntime *)0x0;
      if (pCVar9->super_class != 0) {
        pCVar9 = ClassRuntime::getClassFile(this_01);
        pcVar2 = pCVar9->constant_pool;
        pCVar9 = ClassRuntime::getClassFile(this_01);
        pcVar7 = getFormattedConstant(pcVar2,pCVar9->super_class);
        std::__cxx11::string::string((string *)&superClassName,pcVar7,&local_101);
        pCVar8 = MethodArea::loadClassNamed(this_00,&superClassName);
        std::__cxx11::string::~string((string *)&superClassName);
      }
    }
    pFVar4 = VMStack::getTopFrame(local_f8);
    if (pFVar4 == local_100) {
      VVar13 = Frame::popTopOfOperandStack(local_100);
      uVar12 = VVar13._0_8_;
      if (VVar13.type >> 1 == 3) {
        Frame::popTopOfOperandStack(local_100);
      }
      else {
        cVar1 = *fieldDescriptor._M_dataplus._M_p;
        if (cVar1 == 'Z') {
          uVar12 = uVar12 & 0xffffffff;
        }
        else if (cVar1 == 'C') {
          uVar12 = uVar12 & 0xffffffff | 0x200000000;
        }
        else if (cVar1 == 'S') {
          uVar12 = uVar12 & 0xffffffff | 0x300000000;
        }
        else if (cVar1 == 'B') {
          uVar12 = 0x100000001;
        }
      }
      std::__cxx11::string::string((string *)&local_b0,(string *)&fieldName);
      VVar13.printType = (int)uVar12;
      VVar13.type = (int)(uVar12 >> 0x20);
      ClassRuntime::putValueIntoField(this_01,VVar13,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      local_100->pc = local_100->pc + 3;
    }
    std::__cxx11::string::~string((string *)&fieldDescriptor);
    std::__cxx11::string::~string((string *)&fieldName);
    std::__cxx11::string::~string((string *)&className);
    return;
  }
  __assert_fail("nameAndTypeCP.tag == CONSTANT_NameAndType",
                "/workspace/llm4binary/github/license_all_cmakelists_25/gabepk[P]jvm/src/executionengine.cpp"
                ,0xe2c,"void ExecutionEngine::i_putstatic()");
}

Assistant:

void ExecutionEngine::i_putstatic() {
    VMStack &stackFrame = VMStack::getInstance();
    Frame *topFrame = stackFrame.getTopFrame();
    cp_info *constantPool = *(topFrame->getConstantPool());
    u1 *code = topFrame->getCode(topFrame->pc);

    u1 byte1 = code[1];
    u1 byte2 = code[2];

    uint16_t fieldIndex = (byte1 << 8) | byte2;
    cp_info fieldCP = constantPool[fieldIndex-1];
    assert(fieldCP.tag == CONSTANT_Fieldref); // precisa ser um fieldRef

    CONSTANT_Fieldref_info fieldRef = fieldCP.info.fieldref_info;

    string className = getFormattedConstant(constantPool, fieldRef.class_index);

    cp_info nameAndTypeCP = constantPool[fieldRef.name_and_type_index-1];
    assert(nameAndTypeCP.tag == CONSTANT_NameAndType); // precisa ser um nameAndType

    CONSTANT_NameAndType_info fieldNameAndType = nameAndTypeCP.info.nameAndType_info;

    string fieldName = getFormattedConstant(constantPool, fieldNameAndType.name_index);
    string fieldDescriptor = getFormattedConstant(constantPool, fieldNameAndType.descriptor_index);

    MethodArea &methodArea = MethodArea::getInstance();
    ClassRuntime *classRuntime = methodArea.loadClassNamed(className);

    while (classRuntime != NULL) {
        if (classRuntime->fieldExists(fieldName) == false) {
            if (classRuntime->getClassFile()->super_class == 0) {
                classRuntime = NULL;
            } else {
                string superClassName = getFormattedConstant(classRuntime->getClassFile()->constant_pool, classRuntime->getClassFile()->super_class);
                classRuntime = methodArea.loadClassNamed(superClassName);
            }
        } else {
            break;
        }
    }

    if (classRuntime == NULL) {
        cerr << "NoSuchFieldError" << endl;
        exit(1);
    }

    // se a stack frame mudou, é porque teve <clinit> adicionado, então terminar a execução da instrução para eles serem executados.
    if (stackFrame.getTopFrame() != topFrame) return;
    
    Value topValue = topFrame->popTopOfOperandStack();
    if (topValue.type == ValueType::DOUBLE || topValue.type == ValueType::LONG) {
        topFrame->popTopOfOperandStack(); // removendo padding
    } else {
        switch (fieldDescriptor[0]) {
            case 'B':
                topValue.type = ValueType::BYTE;
                topValue.printType = ValueType::BYTE;
                break;
            case 'C':
                topValue.type = ValueType::CHAR;
                topValue.type = ValueType::CHAR;
                break;
            case 'S':
                topValue.type = ValueType::SHORT;
                topValue.type = ValueType::SHORT;
                break;
            case 'Z':
                topValue.type = ValueType::BOOLEAN;
                topValue.type = ValueType::BOOLEAN;
                break;
        }
    }

    classRuntime->putValueIntoField(topValue, fieldName);

    topFrame->pc += 3;
}